

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

char * __thiscall cmTarget::GetSuffixVariableInternal(cmTarget *this,ArtifactType artifact)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  string local_38;
  
  switch(this->TargetTypeValue) {
  case EXECUTABLE:
    if (artifact == ImportLibraryArtifact) {
      return "CMAKE_IMPORT_LIBRARY_SUFFIX";
    }
    if (artifact == RuntimeBinaryArtifact) {
      if (this->IsAndroid != true) {
        return "CMAKE_EXECUTABLE_SUFFIX";
      }
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ANDROID_GUI","");
      pcVar2 = GetProperty(this,&local_38);
      bVar1 = cmSystemTools::IsOn(pcVar2);
      pcVar2 = "CMAKE_EXECUTABLE_SUFFIX";
      if (bVar1) {
        pcVar2 = "CMAKE_SHARED_LIBRARY_SUFFIX";
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        return pcVar2;
      }
      return pcVar2;
    }
  default:
    return "";
  case STATIC_LIBRARY:
    return "CMAKE_STATIC_LIBRARY_SUFFIX";
  case SHARED_LIBRARY:
    pcVar2 = "";
    if (artifact == ImportLibraryArtifact) {
      pcVar2 = "CMAKE_IMPORT_LIBRARY_SUFFIX";
    }
    pcVar3 = "CMAKE_SHARED_LIBRARY_SUFFIX";
    break;
  case MODULE_LIBRARY:
    pcVar2 = "";
    if (artifact == ImportLibraryArtifact) {
      pcVar2 = "CMAKE_IMPORT_LIBRARY_SUFFIX";
    }
    pcVar3 = "CMAKE_SHARED_MODULE_SUFFIX";
  }
  if (artifact != RuntimeBinaryArtifact) {
    pcVar3 = pcVar2;
  }
  return pcVar3;
}

Assistant:

const char* cmTargetPropertyComputer::GetSources<cmTarget>(
  cmTarget const* tgt, cmMessenger* messenger,
  cmListFileBacktrace const& context)
{
  cmStringRange entries = tgt->GetSourceEntries();
  if (entries.empty()) {
    return CM_NULLPTR;
  }

  std::ostringstream ss;
  const char* sep = "";
  for (std::vector<std::string>::const_iterator i = entries.begin();
       i != entries.end(); ++i) {
    std::string const& entry = *i;

    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    for (std::vector<std::string>::const_iterator li = files.begin();
         li != files.end(); ++li) {
      if (cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
          (*li)[li->size() - 1] == '>') {
        std::string objLibName = li->substr(17, li->size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          ss << sep;
          sep = ";";
          ss << *li;
          continue;
        }

        bool addContent = false;
        bool noMessage = true;
        std::ostringstream e;
        cmake::MessageType messageType = cmake::AUTHOR_WARNING;
        switch (context.GetBottom().GetPolicy(cmPolicies::CMP0051)) {
          case cmPolicies::WARN:
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
            noMessage = false;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::NEW:
            addContent = true;
        }
        if (!noMessage) {
          e << "Target \"" << tgt->GetName()
            << "\" contains "
               "$<TARGET_OBJECTS> generator expression in its sources "
               "list.  "
               "This content was not previously part of the SOURCES "
               "property "
               "when that property was read at configure time.  Code "
               "reading "
               "that property needs to be adapted to ignore the generator "
               "expression using the string(GENEX_STRIP) command.";
          messenger->IssueMessage(messageType, e.str(), context);
        }
        if (addContent) {
          ss << sep;
          sep = ";";
          ss << *li;
        }
      } else if (cmGeneratorExpression::Find(*li) == std::string::npos) {
        ss << sep;
        sep = ";";
        ss << *li;
      } else {
        cmSourceFile* sf = tgt->GetMakefile()->GetOrCreateSource(*li);
        // Construct what is known about this source file location.
        cmSourceFileLocation const& location = sf->GetLocation();
        std::string sname = location.GetDirectory();
        if (!sname.empty()) {
          sname += "/";
        }
        sname += location.GetName();

        ss << sep;
        sep = ";";
        // Append this list entry.
        ss << sname;
      }
    }
  }
  static std::string srcs;
  srcs = ss.str();
  return srcs.c_str();
}